

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

QList<QTableWidgetItem_*> * __thiscall
QTableWidget::selectedItems(QList<QTableWidgetItem_*> *__return_storage_ptr__,QTableWidget *this)

{
  char cVar1;
  QTableModel *this_00;
  QTableWidgetItem *pQVar2;
  QModelIndexList *__range1;
  long lVar3;
  QModelIndex *index;
  QModelIndex *index_00;
  long in_FS_OFFSET;
  QTableWidgetItem *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::selectionModel((QAbstractItemView *)this);
  QItemSelectionModel::selectedIndexes();
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QTableWidgetItem **)0x0;
  (__return_storage_ptr__->d).size = 0;
  index_00 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  lVar3 = -0x10;
  do {
    cVar1 = (**(code **)(*(long *)&(this->super_QTableView).super_QAbstractItemView.
                                   super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x2c0))
                      (this,index_00);
    if (cVar1 == '\0') {
      this_00 = (QTableModel *)QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
      pQVar2 = QTableModel::item(this_00,index_00);
      if (pQVar2 != (QTableWidgetItem *)0x0) {
        local_40 = pQVar2;
        QtPrivate::QPodArrayOps<QTableWidgetItem*>::emplace<QTableWidgetItem*&>
                  ((QPodArrayOps<QTableWidgetItem*> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,&local_40);
        QList<QTableWidgetItem_*>::end(__return_storage_ptr__);
      }
    }
    index_00 = index_00 + 1;
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  LOCK();
  _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
  UNLOCK();
  if (_DAT_aaaaaaaaaaaaaaaa == 0) {
    QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,0x18,0x10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QTableWidgetItem*> QTableWidget::selectedItems() const
{
    Q_D(const QTableWidget);
    const QModelIndexList indexes = selectionModel()->selectedIndexes();
    QList<QTableWidgetItem*> items;
    for (const auto &index : indexes) {
        if (isIndexHidden(index))
            continue;
        QTableWidgetItem *item = d->tableModel()->item(index);
        if (item)
            items.append(item);
    }
    return items;
}